

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

wstring * utf8ToUtf16(wstring *__return_storage_ptr__,string *utf8Str)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *utf8Str_local;
  wstring *out;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,(int)*pcVar2);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring utf8ToUtf16(const std::string& utf8Str)
{
	// We don't expect any really interesting utf8 characters
	// Try doing this cheaply
	std::wstring out;
	out.reserve(utf8Str.length());

	for (char c : utf8Str)
	{
		out += (static_cast<wchar_t>(c));
	}

	return out;
	/*
	std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>> conv;
	return conv.from_bytes(utf8Str);
	*/
}